

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_column_extra_properties.h
# Opt level: O2

Field_element __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
::get_pivot_value(Naive_vector_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>_>
                  *this)

{
  ID_index IVar1;
  Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>
  *pEVar2;
  Field_element FVar3;
  pointer ppEVar4;
  
  IVar1 = (this->super_Chain_column_option).pivot_;
  FVar3 = 0;
  if (IVar1 != 0xffffffff) {
    ppEVar4 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppEVar4 ==
          (this->column_).
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)4,_true,_false,_true>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return 0;
      }
      pEVar2 = *ppEVar4;
      ppEVar4 = ppEVar4 + 1;
    } while (pEVar2->rowIndex_ != IVar1);
    FVar3 = (pEVar2->super_Entry_field_element_option).element_;
  }
  return FVar3;
}

Assistant:

ID_index get_pivot() const { return pivot_; }